

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O3

double lf::fe::Legendre(uint n,double x,double t)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (n == 0) {
    dVar7 = 1.0;
  }
  else {
    if (n == 1) {
      return (x + x) - t;
    }
    uVar3 = 3;
    uVar2 = n + 1;
    if (n + 1 < 4) {
      uVar2 = 3;
    }
    dVar5 = (x + x) - t;
    dVar8 = 2.0;
    uVar4 = 1;
    dVar7 = dVar5;
    dVar9 = 1.0;
    do {
      dVar6 = dVar7;
      dVar7 = (((double)uVar3 * dVar5) / dVar8) * dVar6 - (((double)uVar4 * t * t) / dVar8) * dVar9;
      dVar8 = dVar8 + 1.0;
      uVar3 = uVar3 + 2;
      iVar1 = uVar4 - uVar2;
      uVar4 = uVar4 + 1;
      dVar9 = dVar6;
    } while (iVar1 != -2);
  }
  return dVar7;
}

Assistant:

double Legendre(unsigned n, double x, double t) {
  if (n == 0) {
    return 1;
  }
  if (n == 1) {
    return 2 * x - t;
  }
  double Pim1 = 1;
  double Pi = 2 * x - t;
  for (unsigned i = 2; i <= n; ++i) {
    const double Pip1 =
        (2 * i - 1) * (2 * x - t) / i * Pi - (i - 1) * t * t / i * Pim1;
    Pim1 = Pi;
    Pi = Pip1;
  }
  return Pi;
}